

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Abc_Obj_t * Io_ReadCreatePi(Abc_Ntk_t *pNtk,char *pName)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pNet;
  char *pName_local;
  Abc_Ntk_t *pNtk_local;
  
  pAVar1 = Abc_NtkFindNet(pNtk,pName);
  if (pAVar1 != (Abc_Obj_t *)0x0) {
    printf("Warning: PI \"%s\" appears twice in the list.\n",pName);
  }
  pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pName);
  pFanin = Abc_NtkCreatePi(pNtk);
  Abc_ObjAddFanin(pAVar1,pFanin);
  return pFanin;
}

Assistant:

Abc_Obj_t * Io_ReadCreatePi( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pNet, * pTerm;
    // get the PI net
    pNet  = Abc_NtkFindNet( pNtk, pName );
    if ( pNet )
        printf( "Warning: PI \"%s\" appears twice in the list.\n", pName );
    pNet  = Abc_NtkFindOrCreateNet( pNtk, pName );
    // add the PI node
    pTerm = Abc_NtkCreatePi( pNtk );
    Abc_ObjAddFanin( pNet, pTerm );
    return pTerm;
}